

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O2

void * __thiscall mymalloc::Heap::bigObjectMalloc(Heap *this,int size)

{
  key_type sa;
  Span *this_00;
  mapped_type *ppSVar1;
  key_type local_28;
  
  sa = (key_type)mmap((void *)0x0,(long)size,3,0x21,0,0);
  this_00 = (Span *)operator_new(0x40);
  Span::Span(this_00,sa,size,1,1,0,size);
  local_28 = sa;
  ppSVar1 = std::
            map<bool_*,_Span_*,_std::greater<bool_*>,_std::allocator<std::pair<bool_*const,_Span_*>_>_>
            ::operator[](&this->spanMap,&local_28);
  *ppSVar1 = this_00;
  return sa;
}

Assistant:

void *mymalloc::Heap::bigObjectMalloc(int size) {
    // ! 注意 mmap 分配的最小单位(似乎是页4KB)
    auto addr = mmap(
            NULL,                 //分配的首地址
            size,                         //分配内存大小(不须是页的整数倍, 但系统会按倍数来分配32位1页=4k)
            PROT_READ | PROT_WRITE,  //映射区域保护权限：读|写
            MAP_ANON | MAP_SHARED,  //匿名映射(不涉及文件io), 后面两个参数忽略
            0,                        //要映射到内存中的文件描述符
            0                      //文件映射的偏移量，通常设置为0，必须是页的整数倍
    );
    // 大对象的管理
    Span *span = new Span(addr, size, 1, 1, 0, size);
    spanMap[(bool*)addr] = span;
    return addr;
}